

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdate(void)

{
  ImGuiID IVar1;
  int iVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  ImVec2 IVar8;
  float tweak_factor;
  ImVec2 scroll_dir;
  ImGuiDir move_dir;
  float scroll_speed;
  ImGuiWindow *window;
  bool input_pressed;
  bool input_down;
  bool activate_pressed;
  bool activate_down;
  bool set_mouse_pos;
  ImGuiKey key_1;
  ImGuiKey *__end2_1;
  ImGuiKey *__begin2_1;
  ImGuiKey (*__range2_1) [7];
  ImGuiKey nav_keyboard_keys_to_change_source [7];
  bool nav_keyboard_active;
  ImGuiKey key;
  ImGuiKey *__end2;
  ImGuiKey *__begin2;
  ImGuiKey (*__range2) [8];
  ImGuiKey nav_gamepad_keys_to_change_source [8];
  bool nav_gamepad_active;
  ImGuiIO *io;
  ImGuiContext *g;
  undefined8 in_stack_fffffffffffffee0;
  ImGuiWindow *this;
  undefined8 in_stack_fffffffffffffee8;
  ImGuiWindow *window_00;
  float local_108;
  float local_104;
  float local_ec;
  float local_d8;
  bool local_d1;
  bool local_d0;
  bool local_cf;
  bool local_ce;
  bool local_cd;
  bool local_cc;
  bool local_cb;
  bool local_ca;
  bool local_c9;
  bool local_c8;
  bool local_c7;
  byte local_c6;
  bool local_c5;
  float local_b8;
  float fStack_b4;
  undefined8 *local_88;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined4 local_60;
  undefined8 uStack_5c;
  undefined4 local_54;
  undefined8 *local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 uStack_18;
  ImGuiIO *local_10;
  ImGuiContext *local_8;
  
  pIVar3 = GImGui;
  local_8 = GImGui;
  local_10 = &GImGui->IO;
  (GImGui->IO).WantSetMousePos = false;
  local_c5 = false;
  if ((local_10->ConfigFlags & 2U) != 0) {
    local_c5 = ((pIVar3->IO).BackendFlags & 1U) != 0;
  }
  uStack_18._7_1_ = local_c5;
  local_38 = 0x26b0000026c;
  local_30 = 0x26e0000026d;
  local_28 = 0x26f00000270;
  local_20 = 0x27200000271;
  if (local_c5 != false) {
    local_50 = &uStack_18;
    local_48 = &local_38;
    local_40 = local_48;
    for (; local_48 != local_50; local_48 = (undefined8 *)((long)local_48 + 4)) {
      local_54 = *(undefined4 *)local_48;
      bVar4 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
      if (bVar4) {
        local_8->NavInputSource = ImGuiInputSource_Gamepad;
      }
    }
  }
  uStack_5c._7_1_ = (local_10->ConfigFlags & 1U) != 0;
  local_78 = 0x20d0000020c;
  local_70 = 0x2020000020e;
  local_68 = 0x20300000201;
  local_60 = 0x204;
  if ((bool)uStack_5c._7_1_) {
    for (local_88 = &local_78; local_88 != &uStack_5c; local_88 = (undefined8 *)((long)local_88 + 4)
        ) {
      bVar4 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
      if (bVar4) {
        local_8->NavInputSource = ImGuiInputSource_Keyboard;
      }
    }
  }
  if (local_8->NavInitResultId != 0) {
    NavInitRequestApplyResult();
  }
  local_8->NavInitRequest = false;
  local_8->NavInitRequestFromMove = false;
  local_8->NavInitResultId = 0;
  local_8->NavJustMovedToId = 0;
  if ((local_8->NavMoveSubmitted & 1U) != 0) {
    NavMoveRequestApplyResult();
  }
  local_8->NavTabbingCounter = 0;
  local_8->NavMoveScoringItems = false;
  local_8->NavMoveSubmitted = false;
  bVar4 = false;
  if (((((local_8->NavMousePosDirty & 1U) != 0) && ((local_8->NavIdIsAlive & 1U) != 0)) &&
      ((local_8->NavDisableHighlight & 1U) == 0)) &&
     (((local_8->NavDisableMouseHover & 1U) != 0 && (local_8->NavWindow != (ImGuiWindow *)0x0)))) {
    bVar4 = true;
  }
  local_8->NavMousePosDirty = false;
  if (local_8->NavWindow != (ImGuiWindow *)0x0) {
    NavSaveLastChildNavWindowIntoParent(local_8->NavWindow);
  }
  if (((local_8->NavWindow != (ImGuiWindow *)0x0) &&
      (local_8->NavWindow->NavLastChildNavWindow != (ImGuiWindow *)0x0)) &&
     (local_8->NavLayer == ImGuiNavLayer_Main)) {
    local_8->NavWindow->NavLastChildNavWindow = (ImGuiWindow *)0x0;
  }
  NavUpdateWindowing();
  if ((((uStack_5c._7_1_ & 1) != 0) || (local_c6 = 0, (uStack_18._7_1_ & 1) != 0)) &&
     (local_c6 = 0, local_8->NavWindow != (ImGuiWindow *)0x0)) {
    local_c6 = (local_8->NavWindow->Flags & 0x40000U) != 0 ^ 0xff;
  }
  local_10->NavActive = (bool)(local_c6 & 1);
  if ((((local_10->NavActive & 1U) == 0) || (local_8->NavId == 0)) ||
     (local_c7 = true, (local_8->NavDisableHighlight & 1U) != 0)) {
    local_c7 = local_8->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  local_10->NavVisible = local_c7;
  NavUpdateCancelRequest();
  local_8->NavActivateInputId = 0;
  local_8->NavActivatePressedId = 0;
  local_8->NavActivateDownId = 0;
  local_8->NavActivateId = 0;
  local_8->NavActivateFlags = 0;
  if (((local_8->NavId == 0) || ((local_8->NavDisableHighlight & 1U) != 0)) ||
     ((local_8->NavWindowingTarget != (ImGuiWindow *)0x0 ||
      ((local_8->NavWindow == (ImGuiWindow *)0x0 || ((local_8->NavWindow->Flags & 0x40000U) != 0))))
     )) goto LAB_0049dc6c;
  if ((uStack_5c._7_1_ & 1) == 0) {
LAB_0049d9a9:
    local_c9 = false;
    if ((uStack_18._7_1_ & 1) != 0) {
      local_c9 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
    }
    local_c8 = local_c9;
  }
  else {
    bVar5 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
    local_c8 = true;
    if (!bVar5) goto LAB_0049d9a9;
  }
  local_ca = false;
  if (local_c8 != false) {
    if ((uStack_5c._7_1_ & 1) == 0) {
LAB_0049da0f:
      local_cc = false;
      if ((uStack_18._7_1_ & 1) != 0) {
        local_cc = IsKeyPressed(ImGuiKey_KeysData_OFFSET,false);
      }
      local_cb = local_cc;
    }
    else {
      bVar5 = IsKeyPressed(ImGuiKey_KeysData_OFFSET,false);
      local_cb = true;
      if (!bVar5) goto LAB_0049da0f;
    }
    local_ca = local_cb;
  }
  if ((uStack_5c._7_1_ & 1) == 0) {
LAB_0049da6d:
    local_ce = false;
    if ((uStack_18._7_1_ & 1) != 0) {
      local_ce = IsKeyDown(ImGuiKey_KeysData_OFFSET);
    }
    local_cd = local_ce;
  }
  else {
    bVar5 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
    local_cd = true;
    if (!bVar5) goto LAB_0049da6d;
  }
  local_cf = false;
  if (local_cd != false) {
    if ((uStack_5c._7_1_ & 1) == 0) {
LAB_0049dad3:
      local_d1 = false;
      if ((uStack_18._7_1_ & 1) != 0) {
        local_d1 = IsKeyPressed(ImGuiKey_KeysData_OFFSET,false);
      }
      local_d0 = local_d1;
    }
    else {
      bVar5 = IsKeyPressed(ImGuiKey_KeysData_OFFSET,false);
      local_d0 = true;
      if (!bVar5) goto LAB_0049dad3;
    }
    local_cf = local_d0;
  }
  if ((local_8->ActiveId == 0) && (local_ca != false)) {
    local_8->NavActivateId = local_8->NavId;
    local_8->NavActivateFlags = 2;
  }
  if (((local_8->ActiveId == 0) || (local_8->ActiveId == local_8->NavId)) && (local_cf != false)) {
    local_8->NavActivateInputId = local_8->NavId;
    local_8->NavActivateFlags = 1;
  }
  if (((local_8->ActiveId == 0) || (local_8->ActiveId == local_8->NavId)) && (local_c8 != false)) {
    local_8->NavActivateDownId = local_8->NavId;
  }
  if (((local_8->ActiveId == 0) || (local_8->ActiveId == local_8->NavId)) && (local_ca != false)) {
    local_8->NavActivatePressedId = local_8->NavId;
  }
LAB_0049dc6c:
  if ((local_8->NavWindow != (ImGuiWindow *)0x0) && ((local_8->NavWindow->Flags & 0x40000U) != 0)) {
    local_8->NavDisableHighlight = true;
  }
  if (local_8->NavNextActivateId != 0) {
    if ((local_8->NavNextActivateFlags & 1U) == 0) {
      IVar1 = local_8->NavNextActivateId;
      local_8->NavActivatePressedId = IVar1;
      local_8->NavActivateDownId = IVar1;
      local_8->NavActivateId = IVar1;
    }
    else {
      local_8->NavActivateInputId = local_8->NavNextActivateId;
    }
    local_8->NavActivateFlags = local_8->NavNextActivateFlags;
  }
  local_8->NavNextActivateId = 0;
  NavUpdateCreateMoveRequest();
  if (local_8->NavMoveDir == -1) {
    NavUpdateCreateTabbingRequest();
  }
  NavUpdateAnyRequestFlag();
  local_8->NavIdIsAlive = false;
  if (((local_8->NavWindow != (ImGuiWindow *)0x0) && ((local_8->NavWindow->Flags & 0x40000U) == 0))
     && (local_8->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    this = local_8->NavWindow;
    fVar6 = ImGuiWindow::CalcFontSize(this);
    fVar6 = (float)(int)(fVar6 * 100.0 * local_10->DeltaTime + 0.5);
    iVar2 = local_8->NavMoveDir;
    if ((((this->DC).NavLayersActiveMask == 0) && (((this->DC).NavHasScroll & 1U) != 0)) &&
       (iVar2 != -1)) {
      if ((iVar2 == 0) || (iVar2 == 1)) {
        local_d8 = -1.0;
        if (iVar2 != 0) {
          local_d8 = 1.0;
        }
        fVar7 = ImFloor(local_d8 * fVar6 + (this->Scroll).x);
        SetScrollX(this,fVar7);
      }
      if ((iVar2 == 2) || (iVar2 == 3)) {
        local_ec = -1.0;
        if (iVar2 != 2) {
          local_ec = 1.0;
        }
        fVar7 = ImFloor(local_ec * fVar6 + (this->Scroll).y);
        SetScrollY(this,fVar7);
      }
    }
    if ((uStack_18._7_1_ & 1) != 0) {
      IVar8 = GetKeyVector2d((ImGuiKey)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                             (ImGuiKey)in_stack_fffffffffffffee8,
                             (ImGuiKey)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                             (ImGuiKey)in_stack_fffffffffffffee0);
      bVar5 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
      if (bVar5) {
        local_104 = 0.1;
      }
      else {
        bVar5 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
        local_108 = 10.0;
        if (!bVar5) {
          local_108 = 1.0;
        }
        local_104 = local_108;
      }
      local_b8 = IVar8.x;
      if (((local_b8 != 0.0) || (NAN(local_b8))) && ((this->ScrollbarX & 1U) != 0)) {
        window_00 = this;
        fVar7 = ImFloor(local_b8 * fVar6 * local_104 + (this->Scroll).x);
        SetScrollX(window_00,fVar7);
      }
      fStack_b4 = IVar8.y;
      if ((fStack_b4 != 0.0) || (NAN(fStack_b4))) {
        fVar6 = ImFloor(fStack_b4 * fVar6 * local_104 + (this->Scroll).y);
        SetScrollY(this,fVar6);
      }
    }
  }
  if (((uStack_5c._7_1_ & 1) == 0) && ((uStack_18._7_1_ & 1) == 0)) {
    local_8->NavDisableHighlight = true;
    bVar4 = false;
    local_8->NavDisableMouseHover = false;
  }
  if (((bVar4) && ((local_10->ConfigFlags & 4U) != 0)) && ((local_10->BackendFlags & 4U) != 0)) {
    IVar8 = NavCalcPreferredRefPos();
    local_10->MousePosPrev = IVar8;
    local_10->MousePos = local_10->MousePosPrev;
    local_10->WantSetMousePos = true;
  }
  local_8->NavScoringDebugCount = 0;
  return;
}

Assistant:

static void ImGui::NavUpdate()
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;

    io.WantSetMousePos = false;
    //if (g.NavScoringDebugCount > 0) IMGUI_DEBUG_LOG_NAV("[nav] NavScoringDebugCount %d for '%s' layer %d (Init:%d, Move:%d)\n", g.NavScoringDebugCount, g.NavWindow ? g.NavWindow->Name : "NULL", g.NavLayer, g.NavInitRequest || g.NavInitResultId != 0, g.NavMoveRequest);

    // Set input source based on which keys are last pressed (as some features differs when used with Gamepad vs Keyboard)
    // FIXME-NAV: Now that keys are separated maybe we can get rid of NavInputSource?
    const bool nav_gamepad_active = (io.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad) != 0 && (io.BackendFlags & ImGuiBackendFlags_HasGamepad) != 0;
    const ImGuiKey nav_gamepad_keys_to_change_source[] = { ImGuiKey_GamepadFaceRight, ImGuiKey_GamepadFaceLeft, ImGuiKey_GamepadFaceUp, ImGuiKey_GamepadFaceDown, ImGuiKey_GamepadDpadRight, ImGuiKey_GamepadDpadLeft, ImGuiKey_GamepadDpadUp, ImGuiKey_GamepadDpadDown };
    if (nav_gamepad_active)
        for (ImGuiKey key : nav_gamepad_keys_to_change_source)
            if (IsKeyDown(key))
                g.NavInputSource = ImGuiInputSource_Gamepad;
    const bool nav_keyboard_active = (io.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) != 0;
    const ImGuiKey nav_keyboard_keys_to_change_source[] = { ImGuiKey_Space, ImGuiKey_Enter, ImGuiKey_Escape, ImGuiKey_RightArrow, ImGuiKey_LeftArrow, ImGuiKey_UpArrow, ImGuiKey_DownArrow };
    if (nav_keyboard_active)
        for (ImGuiKey key : nav_keyboard_keys_to_change_source)
            if (IsKeyDown(key))
                g.NavInputSource = ImGuiInputSource_Keyboard;

    // Process navigation init request (select first/default focus)
    if (g.NavInitResultId != 0)
        NavInitRequestApplyResult();
    g.NavInitRequest = false;
    g.NavInitRequestFromMove = false;
    g.NavInitResultId = 0;
    g.NavJustMovedToId = 0;

    // Process navigation move request
    if (g.NavMoveSubmitted)
        NavMoveRequestApplyResult();
    g.NavTabbingCounter = 0;
    g.NavMoveSubmitted = g.NavMoveScoringItems = false;

    // Schedule mouse position update (will be done at the bottom of this function, after 1) processing all move requests and 2) updating scrolling)
    bool set_mouse_pos = false;
    if (g.NavMousePosDirty && g.NavIdIsAlive)
        if (!g.NavDisableHighlight && g.NavDisableMouseHover && g.NavWindow)
            set_mouse_pos = true;
    g.NavMousePosDirty = false;
    IM_ASSERT(g.NavLayer == ImGuiNavLayer_Main || g.NavLayer == ImGuiNavLayer_Menu);

    // Store our return window (for returning from Menu Layer to Main Layer) and clear it as soon as we step back in our own Layer 0
    if (g.NavWindow)
        NavSaveLastChildNavWindowIntoParent(g.NavWindow);
    if (g.NavWindow && g.NavWindow->NavLastChildNavWindow != NULL && g.NavLayer == ImGuiNavLayer_Main)
        g.NavWindow->NavLastChildNavWindow = NULL;

    // Update CTRL+TAB and Windowing features (hold Square to move/resize/etc.)
    NavUpdateWindowing();

    // Set output flags for user application
    io.NavActive = (nav_keyboard_active || nav_gamepad_active) && g.NavWindow && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs);
    io.NavVisible = (io.NavActive && g.NavId != 0 && !g.NavDisableHighlight) || (g.NavWindowingTarget != NULL);

    // Process NavCancel input (to close a popup, get back to parent, clear focus)
    NavUpdateCancelRequest();

    // Process manual activation request
    g.NavActivateId = g.NavActivateDownId = g.NavActivatePressedId = g.NavActivateInputId = 0;
    g.NavActivateFlags = ImGuiActivateFlags_None;
    if (g.NavId != 0 && !g.NavDisableHighlight && !g.NavWindowingTarget && g.NavWindow && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs))
    {
        const bool activate_down = (nav_keyboard_active && IsKeyDown(ImGuiKey_Space)) || (nav_gamepad_active && IsKeyDown(ImGuiKey_NavGamepadActivate));
        const bool activate_pressed = activate_down && ((nav_keyboard_active && IsKeyPressed(ImGuiKey_Space, false)) || (nav_gamepad_active && IsKeyPressed(ImGuiKey_NavGamepadActivate, false)));
        const bool input_down = (nav_keyboard_active && IsKeyDown(ImGuiKey_Enter)) || (nav_gamepad_active && IsKeyDown(ImGuiKey_NavGamepadInput));
        const bool input_pressed = input_down && ((nav_keyboard_active && IsKeyPressed(ImGuiKey_Enter, false)) || (nav_gamepad_active && IsKeyPressed(ImGuiKey_NavGamepadInput, false)));
        if (g.ActiveId == 0 && activate_pressed)
        {
            g.NavActivateId = g.NavId;
            g.NavActivateFlags = ImGuiActivateFlags_PreferTweak;
        }
        if ((g.ActiveId == 0 || g.ActiveId == g.NavId) && input_pressed)
        {
            g.NavActivateInputId = g.NavId;
            g.NavActivateFlags = ImGuiActivateFlags_PreferInput;
        }
        if ((g.ActiveId == 0 || g.ActiveId == g.NavId) && activate_down)
            g.NavActivateDownId = g.NavId;
        if ((g.ActiveId == 0 || g.ActiveId == g.NavId) && activate_pressed)
            g.NavActivatePressedId = g.NavId;
    }
    if (g.NavWindow && (g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs))
        g.NavDisableHighlight = true;
    if (g.NavActivateId != 0)
        IM_ASSERT(g.NavActivateDownId == g.NavActivateId);

    // Process programmatic activation request
    // FIXME-NAV: Those should eventually be queued (unlike focus they don't cancel each others)
    if (g.NavNextActivateId != 0)
    {
        if (g.NavNextActivateFlags & ImGuiActivateFlags_PreferInput)
            g.NavActivateInputId = g.NavNextActivateId;
        else
            g.NavActivateId = g.NavActivateDownId = g.NavActivatePressedId = g.NavNextActivateId;
        g.NavActivateFlags = g.NavNextActivateFlags;
    }
    g.NavNextActivateId = 0;

    // Process move requests
    NavUpdateCreateMoveRequest();
    if (g.NavMoveDir == ImGuiDir_None)
        NavUpdateCreateTabbingRequest();
    NavUpdateAnyRequestFlag();
    g.NavIdIsAlive = false;

    // Scrolling
    if (g.NavWindow && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.NavWindowingTarget)
    {
        // *Fallback* manual-scroll with Nav directional keys when window has no navigable item
        ImGuiWindow* window = g.NavWindow;
        const float scroll_speed = IM_ROUND(window->CalcFontSize() * 100 * io.DeltaTime); // We need round the scrolling speed because sub-pixel scroll isn't reliably supported.
        const ImGuiDir move_dir = g.NavMoveDir;
        if (window->DC.NavLayersActiveMask == 0x00 && window->DC.NavHasScroll && move_dir != ImGuiDir_None)
        {
            if (move_dir == ImGuiDir_Left || move_dir == ImGuiDir_Right)
                SetScrollX(window, ImFloor(window->Scroll.x + ((move_dir == ImGuiDir_Left) ? -1.0f : +1.0f) * scroll_speed));
            if (move_dir == ImGuiDir_Up || move_dir == ImGuiDir_Down)
                SetScrollY(window, ImFloor(window->Scroll.y + ((move_dir == ImGuiDir_Up) ? -1.0f : +1.0f) * scroll_speed));
        }

        // *Normal* Manual scroll with LStick
        // Next movement request will clamp the NavId reference rectangle to the visible area, so navigation will resume within those bounds.
        if (nav_gamepad_active)
        {
            const ImVec2 scroll_dir = GetKeyVector2d(ImGuiKey_GamepadLStickLeft, ImGuiKey_GamepadLStickRight, ImGuiKey_GamepadLStickUp, ImGuiKey_GamepadLStickDown);
            const float tweak_factor = IsKeyDown(ImGuiKey_NavGamepadTweakSlow) ? 1.0f / 10.0f : IsKeyDown(ImGuiKey_NavGamepadTweakFast) ? 10.0f : 1.0f;
            if (scroll_dir.x != 0.0f && window->ScrollbarX)
                SetScrollX(window, ImFloor(window->Scroll.x + scroll_dir.x * scroll_speed * tweak_factor));
            if (scroll_dir.y != 0.0f)
                SetScrollY(window, ImFloor(window->Scroll.y + scroll_dir.y * scroll_speed * tweak_factor));
        }
    }

    // Always prioritize mouse highlight if navigation is disabled
    if (!nav_keyboard_active && !nav_gamepad_active)
    {
        g.NavDisableHighlight = true;
        g.NavDisableMouseHover = set_mouse_pos = false;
    }

    // Update mouse position if requested
    // (This will take into account the possibility that a Scroll was queued in the window to offset our absolute mouse position before scroll has been applied)
    if (set_mouse_pos && (io.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos) && (io.BackendFlags & ImGuiBackendFlags_HasSetMousePos))
    {
        io.MousePos = io.MousePosPrev = NavCalcPreferredRefPos();
        io.WantSetMousePos = true;
        //IMGUI_DEBUG_LOG_IO("SetMousePos: (%.1f,%.1f)\n", io.MousePos.x, io.MousePos.y);
    }

    // [DEBUG]
    g.NavScoringDebugCount = 0;
#if IMGUI_DEBUG_NAV_RECTS
    if (g.NavWindow)
    {
        ImDrawList* draw_list = GetForegroundDrawList(g.NavWindow);
        if (1) { for (int layer = 0; layer < 2; layer++) { ImRect r = WindowRectRelToAbs(g.NavWindow, g.NavWindow->NavRectRel[layer]); draw_list->AddRect(r.Min, r.Max, IM_COL32(255,200,0,255)); } } // [DEBUG]
        if (1) { ImU32 col = (!g.NavWindow->Hidden) ? IM_COL32(255,0,255,255) : IM_COL32(255,0,0,255); ImVec2 p = NavCalcPreferredRefPos(); char buf[32]; ImFormatString(buf, 32, "%d", g.NavLayer); draw_list->AddCircleFilled(p, 3.0f, col); draw_list->AddText(NULL, 13.0f, p + ImVec2(8,-4), col, buf); }
    }
#endif
}